

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O1

void __thiscall helics::CommonCore::routeMessage(CommonCore *this,ActionMessage *cmd)

{
  int iVar1;
  GlobalFederateId GVar2;
  _func_int *UNRECOVERED_JUMPTABLE;
  bool bVar3;
  FederateStates FVar4;
  route_id rVar5;
  FederateState *this_00;
  ActionMessage ncmd;
  optional<helics::ActionMessage> local_e0;
  
  iVar1 = (cmd->dest_id).gid;
  if ((iVar1 == 0) || (iVar1 == (this->super_BrokerBase).higher_broker_id.gid)) {
    (*(this->super_Core)._vptr_Core[0x6b])(this,0,cmd);
    return;
  }
  if (iVar1 == (this->super_BrokerBase).global_broker_id_local.gid) {
    processCommandsForCore(this,cmd);
    return;
  }
  if ((cmd->dest_id).gid == (this->filterFedID)._M_i.gid) {
    ActionMessage::ActionMessage((ActionMessage *)&local_e0,cmd);
    FilterFederate::handleMessage(this->filterFed,(ActionMessage *)&local_e0);
  }
  else {
    GVar2.gid = (cmd->dest_id).gid;
    if (GVar2.gid == (this->translatorFedID)._M_i.gid) {
      ActionMessage::ActionMessage((ActionMessage *)&local_e0,cmd);
      TranslatorFederate::handleMessage(this->translatorFed,(ActionMessage *)&local_e0);
    }
    else {
      bVar3 = isLocal(this,GVar2);
      GVar2.gid = (cmd->dest_id).gid;
      if (!bVar3) {
        rVar5 = getRoute(this,GVar2);
        UNRECOVERED_JUMPTABLE = (this->super_Core)._vptr_Core[0x6b];
        (*UNRECOVERED_JUMPTABLE)(this,(ulong)(uint)rVar5.rid,cmd,UNRECOVERED_JUMPTABLE);
        return;
      }
      this_00 = getFederateCore(this,GVar2);
      if (this_00 == (FederateState *)0x0) {
        return;
      }
      FVar4 = FederateState::getState(this_00);
      if ((FVar4 != FINISHED) && (FVar4 = FederateState::getState(this_00), FVar4 != ERRORED)) {
        FederateState::addAction(this_00,cmd);
        return;
      }
      FederateState::processPostTerminationAction(&local_e0,this_00,cmd);
      if (local_e0.super__Optional_base<helics::ActionMessage,_false,_false>._M_payload.
          super__Optional_payload<helics::ActionMessage,_true,_false,_false>.
          super__Optional_payload_base<helics::ActionMessage>._M_engaged == true) {
        routeMessage(this,(ActionMessage *)&local_e0);
      }
      if (local_e0.super__Optional_base<helics::ActionMessage,_false,_false>._M_payload.
          super__Optional_payload<helics::ActionMessage,_true,_false,_false>.
          super__Optional_payload_base<helics::ActionMessage>._M_engaged != true) {
        return;
      }
      local_e0.super__Optional_base<helics::ActionMessage,_false,_false>._M_payload.
      super__Optional_payload<helics::ActionMessage,_true,_false,_false>.
      super__Optional_payload_base<helics::ActionMessage>._M_engaged = false;
    }
  }
  ActionMessage::~ActionMessage((ActionMessage *)&local_e0);
  return;
}

Assistant:

void CommonCore::routeMessage(const ActionMessage& cmd)
{
    if ((cmd.dest_id == parent_broker_id) || (cmd.dest_id == higher_broker_id)) {
        transmit(parent_route_id, cmd);
    } else if (cmd.dest_id == global_broker_id_local) {
        processCommandsForCore(cmd);
    } else if (cmd.dest_id == filterFedID) {
        auto ncmd{cmd};
        filterFed->handleMessage(ncmd);
    } else if (cmd.dest_id == translatorFedID) {
        auto ncmd{cmd};
        translatorFed->handleMessage(ncmd);
    } else if (isLocal(cmd.dest_id)) {
        auto* fed = getFederateCore(cmd.dest_id);
        if (fed != nullptr) {
            if ((fed->getState() != FederateStates::FINISHED) &&
                (fed->getState() != FederateStates::ERRORED)) {
                fed->addAction(cmd);
            } else {
                auto rep = fed->processPostTerminationAction(cmd);
                if (rep) {
                    routeMessage(*rep);
                }
            }
        }
    } else {
        auto route = getRoute(cmd.dest_id);
        transmit(route, cmd);
    }
}